

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

char16_t * QUtf8::convertToUnicode(char16_t *dst,QByteArrayView in)

{
  QByteArrayView *this;
  qsizetype qVar1;
  char16_t *pcVar2;
  anon_class_1_0_00000001 *in_RSI;
  long in_FS_OFFSET;
  QByteArrayView bom;
  char16_t *in_stack_00000288;
  QByteArrayView in_stack_00000290;
  QByteArrayView *in_stack_ffffffffffffff88;
  QByteArrayView *in_stack_ffffffffffffff90;
  uchar (*in_stack_ffffffffffffff98) [3];
  bool local_59;
  QByteArrayView local_28;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
  local_28.m_size = -0x5555555555555556;
  local_18.m_size = (qsizetype)in_RSI;
  local_28 = QByteArrayView::fromArray<unsigned_char,_3UL,_true>(in_stack_ffffffffffffff98);
  this = (QByteArrayView *)QByteArrayView::size(&local_18);
  qVar1 = QByteArrayView::size(&local_28);
  local_59 = false;
  if (qVar1 <= (long)this) {
    QByteArrayView::size(&local_28);
    QByteArrayView::first(in_stack_ffffffffffffff88,0x16aeb6);
    local_59 = ::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  if (local_59 != false) {
    QByteArrayView::slice(this,(qsizetype)in_stack_ffffffffffffff90);
  }
  pcVar2 = convertToUnicode<QUtf8::convertToUnicode(char16_t*,QByteArrayView)::__0>
                     (in_stack_00000288,in_stack_00000290,(anon_class_1_0_00000001 *)local_18.m_size
                     );
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pcVar2;
}

Assistant:

char16_t *QUtf8::convertToUnicode(char16_t *dst, QByteArrayView in) noexcept
{
    // check if have to skip a BOM
    auto bom = QByteArrayView::fromArray(utf8bom);
    if (in.size() >= bom.size() && in.first(bom.size()) == bom)
        in.slice(sizeof(utf8bom));

    return convertToUnicode(dst, in, [](char16_t *&dst, ...) {
        // decoding error
        *dst++ = QChar::ReplacementCharacter;
        return true;        // continue decoding
    });
}